

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O2

void nn_sws_start(nn_sws *self,nn_usock *usock,int mode,char *resource,char *host,uint8_t msg_type)

{
  if ((self->usock == (nn_usock *)0x0) && ((self->usock_owner).fsm == (nn_fsm *)0x0)) {
    (self->usock_owner).src = 1;
    (self->usock_owner).fsm = &self->fsm;
    nn_usock_swap_owner(usock,&self->usock_owner);
    self->usock = usock;
    self->mode = mode;
    self->resource = resource;
    self->remote_host = host;
    self->msg_type = msg_type;
    nn_fsm_start(&self->fsm);
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "self->usock == NULL && self->usock_owner.fsm == NULL",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
          ,0xba);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_sws_start (struct nn_sws *self, struct nn_usock *usock, int mode,
    const char *resource, const char *host, uint8_t msg_type)
{
    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_SWS_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->mode = mode;
    self->resource = resource;
    self->remote_host = host;

    self->msg_type = msg_type;

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}